

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int cbs_get_two_digits(CBS *cbs,int *out)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint c;
  
  iVar4 = 0;
  if (cbs->len != 0) {
    pbVar2 = cbs->data;
    cbs->data = pbVar2 + 1;
    cbs->len = cbs->len - 1;
    c = (uint)*pbVar2;
    iVar3 = OPENSSL_isdigit(c);
    if ((iVar3 != 0) && (iVar4 = 0, cbs->len != 0)) {
      pbVar2 = cbs->data;
      cbs->data = pbVar2 + 1;
      cbs->len = cbs->len - 1;
      bVar1 = *pbVar2;
      iVar3 = OPENSSL_isdigit((uint)bVar1);
      if (iVar3 != 0) {
        *out = c * 10 + (uint)bVar1 + -0x210;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}